

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::removeUserDefinedUnit(string *name)

{
  bool bVar1;
  __type _Var2;
  _Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  __lhs;
  _Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  __rhs;
  pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *udun;
  iterator __end2;
  iterator __begin2;
  unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  unit unit;
  key_type *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  unit *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  _Alloc_hider in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffffd0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffd0._M_p,in_stack_ffffffffffffffc8);
  getDefaultFlags();
  unit_cast_from_string((string *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::__cxx11::string::~string(this);
  bVar1 = is_valid(in_stack_ffffffffffffffa0);
  if (bVar1) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
    ::erase((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
             *)this,in_stack_ffffffffffffff88);
    std::
    unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::erase((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)this,(key_type *)in_stack_ffffffffffffff88);
  }
  else {
    __lhs._M_cur = (__node_type *)
                   std::
                   unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_ffffffffffffff88);
    __rhs._M_cur = (__node_type *)
                   std::
                   unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffff88);
    while (bVar1 = std::__detail::operator==
                             ((_Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                               *)&stack0xffffffffffffffb0,
                              (_Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                               *)&stack0xffffffffffffffa8), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::__detail::
      _Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator*((_Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                   *)0x784e4d);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs._M_cur,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __rhs._M_cur);
      if (_Var2) {
        std::
        unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::erase((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)this,(key_type *)in_stack_ffffffffffffff88);
        return;
      }
      std::__detail::
      _Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                    *)this);
    }
  }
  return;
}

Assistant:

void removeUserDefinedUnit(const std::string& name)
{
    // get the currently converted unit
    auto unit = unit_cast_from_string(name);
    if (is_valid(unit)) {
        user_defined_units.erase(name);
        user_defined_unit_names.erase(unit);
    } else {
        for (const auto& udun : user_defined_unit_names) {
            if (udun.second == name) {
                user_defined_unit_names.erase(udun.first);
                break;
            }
        }
    }
}